

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O2

int __thiscall XPMP2::TCPConnection::listen(TCPConnection *this,int __fd,int __n)

{
  int iVar1;
  NetRuntimeError *this_00;
  string sStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar1 = ::listen((this->super_SocketNetworking).f_socket,__fd);
  if (-1 < iVar1) {
    return iVar1;
  }
  this_00 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
  std::operator+(&local_78,"Can\'t listen on socket ",&(this->super_SocketNetworking).f_addr);
  std::operator+(&local_58,&local_78,":");
  std::__cxx11::to_string(&sStack_98,(this->super_SocketNetworking).f_port);
  std::operator+(&local_38,&local_58,&sStack_98);
  NetRuntimeError::NetRuntimeError(this_00,&local_38);
  __cxa_throw(this_00,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
}

Assistant:

void TCPConnection::listen (int numConnections)
{
    if (::listen(f_socket, numConnections) < 0)
        throw NetRuntimeError("Can't listen on socket " + f_addr + ":" + std::to_string(f_port));
}